

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdesolver_smooth.c
# Opt level: O3

void process_iteration(Iterative_Method_parameters *method_parameters,Gas_parameters *gas_parameters
                      ,uint time_iter,uint space_iter,uint global_iter,double **results)

{
  Iterative_Method_parameters *iterative_method_parameters;
  double **ppdVar1;
  clock_t start_time;
  clock_t finish_time;
  double *V;
  Node_status *node_statuses;
  Iterative_Method_parameters *local_68;
  double **local_60;
  double *space_coordinates;
  double *G;
  Grid grid;
  
  local_68 = method_parameters;
  local_60 = results;
  grid_Initialize(&grid,gas_parameters,space_iter,time_iter);
  value_arrays_Construct(&G,&V,grid.X_nodes);
  mesh_elements_Construct(&node_statuses,&space_coordinates,grid.X_nodes);
  mesh_Initialize(node_statuses,space_coordinates,&grid);
  fill_mesh_at_initial_time(G,V,g_start,u_start,space_coordinates,grid.X_nodes);
  start_time = clock();
  iterative_method_parameters = local_68;
  find_approximate_solution(G,V,node_statuses,space_coordinates,gas_parameters,&grid,local_68);
  finish_time = clock();
  ppdVar1 = local_60;
  write_current_results
            (local_60,global_iter,start_time,finish_time,gas_parameters,iterative_method_parameters,
             &grid,space_coordinates,V,G);
  print_results_at_current_iteration((*ppdVar1)[global_iter],global_iter);
  value_arrays_Destruct(G,V);
  mesh_elements_Destruct(node_statuses,space_coordinates);
  return;
}

Assistant:

void process_iteration(Iterative_Method_parameters * method_parameters,
                       Gas_parameters * gas_parameters,
                       unsigned time_iter,
                       unsigned space_iter,
                       unsigned global_iter,
                       double ** results)
{
  Grid grid;
  Node_status * node_statuses;
  double * V;
  double * G;
  double * space_coordinates;
  clock_t start_time;
  clock_t finish_time;

  /* Initialize grid and mesh */
  grid_Initialize (&grid, gas_parameters, space_iter, time_iter);
  value_arrays_Construct (&G, &V, grid.X_nodes);
  mesh_elements_Construct (&node_statuses, &space_coordinates, grid.X_nodes);
  mesh_Initialize (node_statuses, space_coordinates, &grid);
  
  fill_mesh_at_initial_time (G, V, g_start, u_start, space_coordinates, grid.X_nodes); 

  /* Run the solver and calculate time */
  start_time = clock();
  find_approximate_solution (G, V, node_statuses, space_coordinates, gas_parameters,
                             &grid, method_parameters);
  finish_time = clock();

  write_current_results (results, global_iter, start_time, finish_time,
                         gas_parameters, method_parameters,
                         &grid, space_coordinates, V, G);

  /* Print results to file */
  print_results_at_current_iteration (results[0][global_iter], global_iter);
  global_iter++;

  /* Clean up */
  value_arrays_Destruct (G, V);
  mesh_elements_Destruct (node_statuses, space_coordinates);
}